

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Raw.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Raw::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Raw *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_40;
  
  client = *(Client **)this;
  getUrl(&local_40,this,path);
  HttpConsumer::put(__return_storage_ptr__,client,&local_40,parameters);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Raw::create(const Path &path, const Parameters &parameters) {
  return HttpConsumer::put(client_, getUrl(path), parameters);
}